

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::BeginSection
          (BinaryReaderObjdump *this,Index section_index,BinarySection section_code,Offset size)

{
  char *__s1;
  int iVar1;
  char *__s2;
  pointer this_00;
  bool bVar2;
  allocator<char> local_69;
  undefined1 auStack_68 [6];
  bool section_match;
  string local_58 [8];
  string match_name;
  char *section_name;
  Offset size_local;
  BinarySection section_code_local;
  Index section_index_local;
  BinaryReaderObjdump *this_local;
  
  BinaryReaderObjdumpBase::BeginSection
            (&this->super_BinaryReaderObjdumpBase,section_index,section_code,size);
  match_name.field_2._8_8_ = GetSectionName(section_code);
  _auStack_68 = BinaryReaderObjdumpBase::GetSectionName
                          (&this->super_BinaryReaderObjdumpBase,section_index);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_58,(basic_string_view<char,_std::char_traits<char>_> *)auStack_68,&local_69);
  std::allocator<char>::~allocator(&local_69);
  bVar2 = true;
  if (((this->super_BinaryReaderObjdumpBase).options_)->section_name != (char *)0x0) {
    __s1 = ((this->super_BinaryReaderObjdumpBase).options_)->section_name;
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcasecmp(__s1,__s2);
    bVar2 = iVar1 == 0;
  }
  if (bVar2) {
    (this->super_BinaryReaderObjdumpBase).section_found_ = true;
  }
  switch(((this->super_BinaryReaderObjdumpBase).options_)->mode) {
  case Prepass:
  case Disassemble:
    break;
  case Headers:
    printf("%9s start=%#010zx end=%#010zx (size=%#010zx) ",match_name.field_2._8_8_,
           ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
           state)->offset,
           ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
           state)->offset + size,size);
    break;
  case Details:
    if (bVar2) {
      printf("%s");
      if (((section_code == Start) || (section_code == DataCount)) || (section_code == Custom)) {
        printf(":\n");
      }
      (this->super_BinaryReaderObjdumpBase).print_details_ = true;
    }
    else {
      (this->super_BinaryReaderObjdumpBase).print_details_ = false;
    }
    break;
  case RawData:
    if (bVar2) {
      printf("\nContents of section %s:\n",match_name.field_2._8_8_);
      this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::
                operator->(&this->out_stream_);
      Stream::WriteMemoryDump
                (&this_00->super_Stream,
                 (this->super_BinaryReaderObjdumpBase).data_ +
                 ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                  super_BinaryReaderDelegate.state)->offset,size,
                 ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                  super_BinaryReaderDelegate.state)->offset,Yes,(char *)0x0,(char *)0x0);
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::__cxx11::string::~string(local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::BeginSection(Index section_index,
                                         BinarySection section_code,
                                         Offset size) {
  BinaryReaderObjdumpBase::BeginSection(section_index, section_code, size);

  // |section_name| and |match_name| are identical for known sections. For
  // custom sections, |section_name| is "Custom", but |match_name| is the name
  // of the custom section.
  const char* section_name = wabt::GetSectionName(section_code);
  std::string match_name(GetSectionName(section_index));

  bool section_match = !options_->section_name ||
                       !strcasecmp(options_->section_name, match_name.c_str());
  if (section_match) {
    section_found_ = true;
  }

  switch (options_->mode) {
    case ObjdumpMode::Headers:
      printf("%9s start=%#010" PRIzx " end=%#010" PRIzx " (size=%#010" PRIoffset
             ") ",
             section_name, state->offset, state->offset + size, size);
      break;
    case ObjdumpMode::Details:
      if (section_match) {
        printf("%s", section_name);
        // All known section types except the Start and DataCount sections have
        // a count in which case this line gets completed in OnCount().
        if (section_code == BinarySection::Start ||
            section_code == BinarySection::DataCount ||
            section_code == BinarySection::Custom) {
          printf(":\n");
        }
        print_details_ = true;
      } else {
        print_details_ = false;
      }
      break;
    case ObjdumpMode::RawData:
      if (section_match) {
        printf("\nContents of section %s:\n", section_name);
        out_stream_->WriteMemoryDump(data_ + state->offset, size, state->offset,
                                     PrintChars::Yes);
      }
      break;
    case ObjdumpMode::Prepass:
    case ObjdumpMode::Disassemble:
      break;
  }
  return Result::Ok;
}